

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O0

rb_tree_node_base *
nestl::impl::detail::rb_tree_rebalance_for_erase(rb_tree_node_base *z,rb_tree_node_base *header)

{
  rb_tree_node_base *prVar1;
  base_ptr *root_00;
  base_ptr *pprVar2;
  base_ptr *pprVar3;
  base_ptr prVar4;
  bool bVar5;
  rb_tree_node_base *local_58;
  rb_tree_node_base *w_1;
  rb_tree_node_base *w;
  rb_tree_node_base *x_parent;
  rb_tree_node_base *x;
  rb_tree_node_base *y;
  rb_tree_node_base **rightmost;
  rb_tree_node_base **leftmost;
  rb_tree_node_base **root;
  rb_tree_node_base *header_local;
  rb_tree_node_base *z_local;
  
  root_00 = &header->m_parent;
  pprVar2 = &header->m_left;
  pprVar3 = &header->m_right;
  x = z;
  if (z->m_left == (base_ptr)0x0) {
    x_parent = z->m_right;
  }
  else if (z->m_right == (base_ptr)0x0) {
    x_parent = z->m_left;
  }
  else {
    for (x = z->m_right; x->m_left != (base_ptr)0x0; x = x->m_left) {
    }
    x_parent = x->m_right;
  }
  if (x == z) {
    w = x->m_parent;
    if (x_parent != (rb_tree_node_base *)0x0) {
      x_parent->m_parent = x->m_parent;
    }
    if (*root_00 == z) {
      *root_00 = x_parent;
    }
    else if (z->m_parent->m_left == z) {
      z->m_parent->m_left = x_parent;
    }
    else {
      z->m_parent->m_right = x_parent;
    }
    if (*pprVar2 == z) {
      if (z->m_right == (base_ptr)0x0) {
        *pprVar2 = z->m_parent;
      }
      else {
        prVar4 = rb_tree_node_base::s_minimum(x_parent);
        *pprVar2 = prVar4;
      }
    }
    if (*pprVar3 == z) {
      if (z->m_left == (base_ptr)0x0) {
        *pprVar3 = z->m_parent;
      }
      else {
        prVar4 = rb_tree_node_base::s_maximum(x_parent);
        *pprVar3 = prVar4;
      }
    }
  }
  else {
    z->m_left->m_parent = x;
    x->m_left = z->m_left;
    if (x == z->m_right) {
      w = x;
    }
    else {
      w = x->m_parent;
      if (x_parent != (rb_tree_node_base *)0x0) {
        x_parent->m_parent = x->m_parent;
      }
      x->m_parent->m_left = x_parent;
      x->m_right = z->m_right;
      z->m_right->m_parent = x;
    }
    if (*root_00 == z) {
      *root_00 = x;
    }
    else if (z->m_parent->m_left == z) {
      z->m_parent->m_left = x;
    }
    else {
      z->m_parent->m_right = x;
    }
    x->m_parent = z->m_parent;
    std::swap<nestl::impl::detail::rb_tree_color>(&x->m_color,&z->m_color);
    x = z;
  }
  if (x->m_color == rb_red) {
    return x;
  }
  do {
    prVar1 = w;
    bVar5 = false;
    if ((x_parent != *root_00) && (bVar5 = true, x_parent != (rb_tree_node_base *)0x0)) {
      bVar5 = x_parent->m_color == rb_black;
    }
    if (!bVar5) goto LAB_0011ba4a;
    if (x_parent == w->m_left) {
      w_1 = w->m_right;
      if (w_1->m_color == rb_red) {
        w_1->m_color = rb_black;
        w->m_color = rb_red;
        local_rb_tree_rotate_left(w,root_00);
        w_1 = w->m_right;
      }
      if (((w_1->m_left != (base_ptr)0x0) && (w_1->m_left->m_color != rb_black)) ||
         ((w_1->m_right != (base_ptr)0x0 && (w_1->m_right->m_color != rb_black)))) {
        if ((w_1->m_right == (base_ptr)0x0) || (w_1->m_right->m_color == rb_black)) {
          w_1->m_left->m_color = rb_black;
          w_1->m_color = rb_red;
          local_rb_tree_rotate_right(w_1,root_00);
          w_1 = w->m_right;
        }
        w_1->m_color = w->m_color;
        w->m_color = rb_black;
        if (w_1->m_right != (base_ptr)0x0) {
          w_1->m_right->m_color = rb_black;
        }
        local_rb_tree_rotate_left(w,root_00);
LAB_0011ba4a:
        if (x_parent == (rb_tree_node_base *)0x0) {
          return x;
        }
        x_parent->m_color = rb_black;
        return x;
      }
      w_1->m_color = rb_red;
      w = w->m_parent;
    }
    else {
      local_58 = w->m_left;
      if (local_58->m_color == rb_red) {
        local_58->m_color = rb_black;
        w->m_color = rb_red;
        local_rb_tree_rotate_right(w,root_00);
        local_58 = w->m_left;
      }
      if (((local_58->m_right != (base_ptr)0x0) && (local_58->m_right->m_color != rb_black)) ||
         ((local_58->m_left != (base_ptr)0x0 && (local_58->m_left->m_color != rb_black)))) {
        if ((local_58->m_left == (base_ptr)0x0) || (local_58->m_left->m_color == rb_black)) {
          local_58->m_right->m_color = rb_black;
          local_58->m_color = rb_red;
          local_rb_tree_rotate_left(local_58,root_00);
          local_58 = w->m_left;
        }
        local_58->m_color = w->m_color;
        w->m_color = rb_black;
        if (local_58->m_left != (base_ptr)0x0) {
          local_58->m_left->m_color = rb_black;
        }
        local_rb_tree_rotate_right(w,root_00);
        goto LAB_0011ba4a;
      }
      local_58->m_color = rb_red;
      w = w->m_parent;
    }
    x_parent = prVar1;
  } while( true );
}

Assistant:

inline rb_tree_node_base*
rb_tree_rebalance_for_erase(rb_tree_node_base* const z,
                            rb_tree_node_base& header) NESTL_NOEXCEPT_SPEC
{
    rb_tree_node_base *& root = header.m_parent;
    rb_tree_node_base *& leftmost = header.m_left;
    rb_tree_node_base *& rightmost = header.m_right;
    rb_tree_node_base* y = z;
    rb_tree_node_base* x = 0;
    rb_tree_node_base* x_parent = 0;

    if (y->m_left == 0)     // z has at most one non-null child. y == z.
        x = y->m_right;     // x might be null.
    else
        if (y->m_right == 0)  // z has exactly one non-null child. y == z.
            x = y->m_left;    // x is not null.
        else
        {
            // z has two non-null children.  Set y to
            y = y->m_right;   //   z's successor.  x might be null.
            while (y->m_left != 0)
                y = y->m_left;
            x = y->m_right;
        }
    if (y != z)
    {
        // relink y in place of z.  y is z's successor
        z->m_left->m_parent = y;
        y->m_left = z->m_left;
        if (y != z->m_right)
        {
            x_parent = y->m_parent;
            if (x) x->m_parent = y->m_parent;
            y->m_parent->m_left = x;   // y must be a child of m_left
            y->m_right = z->m_right;
            z->m_right->m_parent = y;
        }
        else
            x_parent = y;
        if (root == z)
            root = y;
        else if (z->m_parent->m_left == z)
            z->m_parent->m_left = y;
        else
            z->m_parent->m_right = y;
        y->m_parent = z->m_parent;
        std::swap(y->m_color, z->m_color);
        y = z;
        // y now points to node to be actually deleted
    }
    else
    {                        // y == z
        x_parent = y->m_parent;
        if (x)
            x->m_parent = y->m_parent;
        if (root == z)
            root = x;
        else
            if (z->m_parent->m_left == z)
                z->m_parent->m_left = x;
            else
                z->m_parent->m_right = x;
        if (leftmost == z)
        {
            if (z->m_right == 0)        // z->m_left must be null also
                leftmost = z->m_parent;
            // makes leftmost == _M_header if z == root
            else
                leftmost = rb_tree_node_base::s_minimum(x);
        }
        if (rightmost == z)
        {
            if (z->m_left == 0)         // z->m_right must be null also
                rightmost = z->m_parent;
            // makes rightmost == _M_header if z == root
            else                      // x == z->m_left
                rightmost = rb_tree_node_base::s_maximum(x);
        }
    }
    if (y->m_color != rb_red)
      {
    while (x != root && (x == 0 || x->m_color == rb_black))
      if (x == x_parent->m_left)
        {
          rb_tree_node_base* w = x_parent->m_right;
          if (w->m_color == rb_red)
        {
          w->m_color = rb_black;
          x_parent->m_color = rb_red;
          local_rb_tree_rotate_left(x_parent, root);
          w = x_parent->m_right;
        }
          if ((w->m_left == 0 ||
           w->m_left->m_color == rb_black) &&
          (w->m_right == 0 ||
           w->m_right->m_color == rb_black))
        {
          w->m_color = rb_red;
          x = x_parent;
          x_parent = x_parent->m_parent;
        }
          else
        {
          if (w->m_right == 0
              || w->m_right->m_color == rb_black)
            {
              w->m_left->m_color = rb_black;
              w->m_color = rb_red;
              local_rb_tree_rotate_right(w, root);
              w = x_parent->m_right;
            }
          w->m_color = x_parent->m_color;
          x_parent->m_color = rb_black;
          if (w->m_right)
            w->m_right->m_color = rb_black;
          local_rb_tree_rotate_left(x_parent, root);
          break;
        }
        }
      else
        {
          // same as above, with m_right <-> m_left.
          rb_tree_node_base* w = x_parent->m_left;
          if (w->m_color == rb_red)
        {
          w->m_color = rb_black;
          x_parent->m_color = rb_red;
          local_rb_tree_rotate_right(x_parent, root);
          w = x_parent->m_left;
        }
          if ((w->m_right == 0 ||
           w->m_right->m_color == rb_black) &&
          (w->m_left == 0 ||
           w->m_left->m_color == rb_black))
        {
          w->m_color = rb_red;
          x = x_parent;
          x_parent = x_parent->m_parent;
        }
          else
        {
          if (w->m_left == 0 || w->m_left->m_color == rb_black)
            {
              w->m_right->m_color = rb_black;
              w->m_color = rb_red;
              local_rb_tree_rotate_left(w, root);
              w = x_parent->m_left;
            }
          w->m_color = x_parent->m_color;
          x_parent->m_color = rb_black;
          if (w->m_left)
            w->m_left->m_color = rb_black;
          local_rb_tree_rotate_right(x_parent, root);
          break;
        }
        }
    if (x) x->m_color = rb_black;
      }
    return y;
  }